

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLinLog>::
ShadedRenderer(ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLinLog>
               *this,GetterXsYs<int> *getter1,GetterXsYRef<int> *getter2,
              TransformerLinLog *transformer,ImU32 col)

{
  double dVar1;
  int iVar2;
  ImPlotPlot *pIVar3;
  GetterXsYRef<int> *pGVar4;
  TransformerLinLog *pTVar5;
  double dVar6;
  ImPlotContext *pIVar7;
  int iVar8;
  long lVar9;
  ImVec2 IVar10;
  ImVec2 IVar11;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar2 = getter1->Count;
  iVar8 = getter2->Count;
  if (iVar2 < getter2->Count) {
    iVar8 = iVar2;
  }
  this->Prims = iVar8 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  pIVar7 = GImPlot;
  (this->P12).y = 0.0;
  lVar9 = (long)((getter1->Offset % iVar2 + iVar2) % iVar2) * (long)getter1->Stride;
  iVar2 = *(int *)((long)getter1->Xs + lVar9);
  dVar6 = log10((double)*(int *)((long)getter1->Ys + lVar9) /
                GImPlot->CurrentPlot->YAxis[transformer->YAxis].Range.Min);
  iVar8 = transformer->YAxis;
  pIVar3 = pIVar7->CurrentPlot;
  dVar1 = pIVar3->YAxis[iVar8].Range.Min;
  IVar10.x = (float)(((double)iVar2 - (pIVar3->XAxis).Range.Min) * pIVar7->Mx +
                    (double)pIVar7->PixelRange[iVar8].Min.x);
  IVar10.y = (float)((((double)(float)(dVar6 / pIVar7->LogDenY[iVar8]) *
                       (pIVar3->YAxis[iVar8].Range.Max - dVar1) + dVar1) - dVar1) *
                     pIVar7->My[iVar8] + (double)pIVar7->PixelRange[iVar8].Min.y);
  this->P11 = IVar10;
  pIVar7 = GImPlot;
  pGVar4 = this->Getter2;
  pTVar5 = this->Transformer;
  iVar2 = pGVar4->Count;
  iVar2 = *(int *)((long)pGVar4->Xs +
                  (long)((pGVar4->Offset % iVar2 + iVar2) % iVar2) * (long)pGVar4->Stride);
  dVar6 = log10(pGVar4->YRef / GImPlot->CurrentPlot->YAxis[pTVar5->YAxis].Range.Min);
  iVar8 = pTVar5->YAxis;
  pIVar3 = pIVar7->CurrentPlot;
  dVar1 = pIVar3->YAxis[iVar8].Range.Min;
  IVar11.x = (float)(((double)iVar2 - (pIVar3->XAxis).Range.Min) * pIVar7->Mx +
                    (double)pIVar7->PixelRange[iVar8].Min.x);
  IVar11.y = (float)((((double)(float)(dVar6 / pIVar7->LogDenY[iVar8]) *
                       (pIVar3->YAxis[iVar8].Range.Max - dVar1) + dVar1) - dVar1) *
                     pIVar7->My[iVar8] + (double)pIVar7->PixelRange[iVar8].Min.y);
  this->P12 = IVar11;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }